

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double hypergeometric_pdf(int x,int n,int m,int l)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (-1 < x) {
    if (l < x || (m < x || n < x)) {
      return 0.0;
    }
    if (n != 0) {
      dVar1 = i4_choose_log(m,x);
      dVar2 = i4_choose_log(l - m,n - x);
      dVar3 = i4_choose_log(l,n);
      dVar1 = exp((dVar2 + dVar1) - dVar3);
      return dVar1;
    }
    if (x != 0) {
      return 0.0;
    }
  }
  return 1.0;
}

Assistant:

double hypergeometric_pdf ( int x, int n, int m, int l )

//****************************************************************************80
//
//  Purpose:
//
//    HYPERGEOMETRIC_PDF evaluates the Hypergeometric PDF.
//
//  Discussion:
//
//    PDF(N,M,L;X) = C(M,X) * C(L-M,N-X) / C(L,N).
//
//    PDF(N,M,L;X) is the probability of drawing X white balls in a
//    single random sample of size N from a population containing
//    M white balls and a total of L balls.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the desired number of white balls.
//    0 <= X <= N, usually, although any value of X can be given.
//
//    Input, int N, the number of balls selected.
//    0 <= N <= L.
//
//    Input, int M, the number of white balls in the population.
//    0 <= M <= L.
//
//    Input, int L, the number of balls to select from.
//    0 <= L.
//
//    Output, double HYPERGEOMETRIC_PDF, the probability of exactly K white balls.
//
{
  double c1;
  double c2;
  double c3;
  double pdf;
  double pdf_log;
//
//  Special cases.
//
  if ( x < 0 )
  {
    pdf = 1.0;
  }
  else if ( n < x )
  {
    pdf = 0.0;
  }
  else if ( m < x )
  {
    pdf = 0.0;
  }
  else if ( l < x )
  {
    pdf = 0.0;
  }
  else if ( n == 0 )
  {
    if ( x == 0 )
    {
      pdf = 1.0;
    }
    else
    {
      pdf = 0.0;
    }
  }
  else
  {
    c1 = i4_choose_log ( m, x );
    c2 = i4_choose_log ( l-m, n-x );
    c3 = i4_choose_log ( l, n );

    pdf_log = c1 + c2 - c3;

    pdf = exp ( pdf_log );

  }

  return pdf;
}